

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenTupleMake(BinaryenModuleRef module,BinaryenExpressionRef *operands,BinaryenIndex numOperands
                 )

{
  ulong uVar1;
  TupleMake *pTVar2;
  Builder local_50;
  undefined1 auStack_48 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> ops;
  
  auStack_48 = (undefined1  [8])0x0;
  ops.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ops.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::resize
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_48,
             (ulong)numOperands);
  if (numOperands != 0) {
    uVar1 = 0;
    do {
      *(BinaryenExpressionRef *)((long)auStack_48 + uVar1 * 8) = operands[uVar1];
      uVar1 = uVar1 + 1;
    } while (numOperands != uVar1);
  }
  local_50.wasm = module;
  pTVar2 = wasm::Builder::
           makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&>
                     (&local_50,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_48)
  ;
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)ops.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  return (BinaryenExpressionRef)pTVar2;
}

Assistant:

BinaryenExpressionRef BinaryenTupleMake(BinaryenModuleRef module,
                                        BinaryenExpressionRef* operands,
                                        BinaryenIndex numOperands) {
  std::vector<Expression*> ops;
  ops.resize(numOperands);
  for (size_t i = 0; i < numOperands; ++i) {
    ops[i] = (Expression*)operands[i];
  }
  return static_cast<Expression*>(Builder(*(Module*)module).makeTupleMake(ops));
}